

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

u8 __thiscall GB::sub(GB *this,u8 x,u8 c)

{
  byte bVar1;
  byte bVar2;
  int res;
  int r;
  u8 c_local;
  u8 x_local;
  GB *this_local;
  
  res = ((uint)(this->s).field_2.field_0.a - (uint)x) - (uint)c;
  bVar1 = zflag((u8)res);
  bVar2 = hflag(res,(uint)(this->s).field_2.field_0.a,(uint)x);
  (this->s).field_2.field_0.f = bVar1 | 0x40 | bVar2 | (byte)(res >> 4) & 0x10;
  return (u8)res;
}

Assistant:

u8 GB::sub(u8 x, u8 c) {
  int r = s.a - x - c;
  s.f = zflag(r) | FN | hflag(r, s.a, x) | ((r >> 4) & FC);
  return r;
}